

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

void mstl(double *x,int N,int *f,int *Nseas,int *s_window,double *lambda,int *iterate,
         double **seasonal,double *trend,double *remainder)

{
  size_t __size;
  double *pdVar1;
  void *pvVar2;
  int iVar3;
  size_t __nmemb;
  double *y;
  int *pos;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int N_00;
  uint N_01;
  int N_02;
  int f_00;
  ulong uVar10;
  ulong uVar11;
  int local_54;
  void *pvStack_50;
  int s_window_;
  size_t local_48;
  double *local_40;
  int local_38;
  uint local_34;
  
  if (s_window == (int *)0x0) {
    local_54 = 0xd;
  }
  else {
    local_54 = *s_window;
  }
  if (iterate == (int *)0x0) {
    local_38 = 2;
  }
  else {
    local_38 = *iterate;
  }
  __nmemb = (size_t)N;
  __size = __nmemb * 8;
  y = (double *)malloc(__size);
  local_34 = N;
  if (lambda == (double *)0x0) {
    memcpy(y,x,__size);
  }
  else {
    boxcox(x,N,lambda,y);
  }
  lVar9 = (long)*Nseas;
  local_40 = (double *)malloc(lVar9 * 8);
  N_01 = local_34;
  if (lVar9 < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if (f[lVar6] < (int)local_34 / 2) {
        local_40[(int)uVar5] = (double)f[lVar6];
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar9 != lVar6);
  }
  uVar10 = (ulong)local_34;
  N_02 = (int)uVar5;
  local_48 = __size;
  pos = (int *)malloc((long)N_02 * 4);
  sort1d_ascending(local_40,N_02,pos);
  if (N_02 < 1) {
    pdVar4 = (double *)malloc(local_48);
    if ((int)N_01 < 1) {
      supsmu(pdVar4,N_01,y,(double *)0x0,1,0.0,-1.0,trend);
    }
    else {
      uVar5 = 0;
      do {
        pdVar4[uVar5] = (double)(int)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar5);
      supsmu(pdVar4,N_01,y,(double *)0x0,1,0.0,-1.0,trend);
      if (0 < (int)local_34) {
        uVar5 = 0;
        do {
          remainder[uVar5] = y[uVar5] - trend[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
      }
    }
    *Nseas = 0;
    free(pdVar4);
  }
  else {
    pvStack_50 = calloc((long)(int)(N_02 * N_01),8);
    pdVar4 = (double *)calloc(__nmemb,8);
    memcpy(pdVar4,y,local_48);
    if (0 < local_38) {
      iVar3 = 0;
      uVar7 = uVar10;
      do {
        uVar8 = 0;
        uVar11 = 0;
        do {
          pvVar2 = pvStack_50;
          N_00 = (int)uVar7;
          if (N_00 < 1) {
            f_00 = (int)local_40[uVar11];
            stl(pdVar4,N_00,f_00,"null",&local_54,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
                (int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
                (double *)((long)pvStack_50 + uVar11 * __nmemb * 8),trend,remainder);
          }
          else {
            uVar7 = 0;
            do {
              pdVar4[uVar7] = *(double *)((long)pvStack_50 + uVar7 * 8 + uVar8 * 8) + pdVar4[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar10 != uVar7);
            local_48 = CONCAT44(local_48._4_4_,(int)local_40[uVar11]);
            stl(pdVar4,N_00,(int)local_40[uVar11],"null",&local_54,(int *)0x0,(int *)0x0,(int *)0x0,
                (int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
                (int *)0x0,(double *)((long)pvStack_50 + uVar11 * __nmemb * 8),trend,remainder);
            if (0 < (int)local_34) {
              uVar7 = 0;
              do {
                pdVar4[uVar7] = pdVar4[uVar7] - *(double *)((long)pvVar2 + uVar7 * 8 + uVar8 * 8);
                uVar7 = uVar7 + 1;
              } while (uVar10 != uVar7);
            }
            f_00 = (int)local_48;
          }
          uVar7 = (ulong)local_34;
          f[uVar11] = f_00;
          uVar11 = uVar11 + 1;
          uVar8 = (ulong)((int)uVar8 + local_34);
        } while (uVar11 != uVar5);
        iVar3 = iVar3 + 1;
        N_01 = local_34;
      } while (iVar3 != local_38);
    }
    if (0 < (int)N_01) {
      uVar7 = 0;
      do {
        remainder[uVar7] = pdVar4[uVar7] - trend[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    uVar7 = 0;
    uVar8 = 0;
    do {
      if (0 < (int)N_01) {
        pdVar1 = seasonal[uVar8];
        uVar11 = 0;
        do {
          pdVar1[uVar11] = *(double *)((long)pvStack_50 + uVar11 * 8 + uVar7 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      uVar8 = uVar8 + 1;
      uVar7 = (ulong)((int)uVar7 + N_01);
    } while (uVar8 != uVar5);
    *Nseas = N_02;
    free(pvStack_50);
    free(pdVar4);
  }
  free(y);
  free(pos);
  free(local_40);
  return;
}

Assistant:

void mstl(double *x, int N, int *f, int *Nseas, int *s_window,double *lambda,int *iterate, double **seasonal, double *trend,double *remainder) {
    int i,j,k,s_window_,Niter,iterate_,iter,freq;
    double *y,*t,*deseas;
    double *msts,*seas;
    int *pos;

    Niter = 0;

    s_window_ = (s_window == NULL) ? 13 : *s_window;
    iterate_ = (iterate == NULL) ? 2 : *iterate;

    y = (double*)malloc(sizeof(double)*N);

    if (lambda != NULL) {
        boxcox(x,N,lambda,y);
    } else {
        memcpy(y,x,sizeof(double)*N);
    }

    msts = (double*)malloc(sizeof(double)*(*Nseas));

    for(i = 0; i < *Nseas;++i) {
        if (f[i] < N / 2) {
            msts[Niter] = (double) f[i];
            Niter++;
        }
    }

    pos = (int*)malloc(sizeof(int)*Niter);

    sort1d_ascending(msts,Niter,pos);

    if (Niter > 0) {

        seas = (double*)calloc(Niter*N,sizeof(double));
        deseas = (double*)calloc(N,sizeof(double));

        memcpy(deseas,y,sizeof(double)*N);

        for(j = 0; j < iterate_;++j) {
            for(i = 0; i < Niter;++i) {
                iter = i * N;
                for(k = 0; k < N;++k) {
                    deseas[k] += seas[iter+k];
                }
                freq = (int) msts[i];
                stl(deseas,N,freq,"null",&s_window_,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seas+iter,trend,remainder);
                for(k = 0; k < N;++k) {
                    deseas[k] -= seas[iter+k];
                }
                f[i] = freq;
            }
        }

        for(i = 0; i < N;++i) {
            remainder[i] = deseas[i] - trend[i];
        }
        for(i = 0; i < Niter;++i) {
            iter = i * N;
            for(j = 0; j < N;++j) {
                seasonal[i][j] = seas[iter+j];
            }
        }

        *Nseas = Niter;

        free(seas);
        free(deseas);
    } else {
        t = (double*) malloc(sizeof(double)*N);
        for(i = 0; i < N;++i) {
            t[i] = i;
        }
        supsmu(t,N,y,NULL,1,0,-1.0,trend);
        for(i = 0; i < N;++i) {
            remainder[i] = y[i] - trend[i];
        }
        *Nseas = 0;
        free(t);
    }


    free(y);
    free(pos);
    free(msts);
}